

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O3

omp_allocator_handle_t
omp_init_allocator_(omp_memspace_handle_t *m,int *ntraits,omp_alloctrait_t *tr)

{
  int gtid;
  omp_allocator_handle_t pvVar1;
  
  gtid = __kmp_get_global_thread_id_reg();
  pvVar1 = __kmpc_init_allocator(gtid,*m,*ntraits,tr);
  return pvVar1;
}

Assistant:

omp_allocator_handle_t FTN_STDCALL
FTN_INIT_ALLOCATOR(omp_memspace_handle_t KMP_DEREF m, int KMP_DEREF ntraits,
                   omp_alloctrait_t tr[]) {
#ifdef KMP_STUB
  return NULL;
#else
  return __kmpc_init_allocator(__kmp_entry_gtid(), KMP_DEREF m,
                               KMP_DEREF ntraits, tr);
#endif
}